

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<spvc_combined_image_sampler,_8UL> * __thiscall
spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::operator=
          (SmallVector<spvc_combined_image_sampler,_8UL> *this,
          SmallVector<spvc_combined_image_sampler,_8UL> *other)

{
  spvc_combined_image_sampler *psVar1;
  size_t sVar2;
  spvc_combined_image_sampler *psVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  (this->super_VectorView<spvc_combined_image_sampler>).buffer_size = 0;
  psVar3 = (other->super_VectorView<spvc_combined_image_sampler>).ptr;
  if (psVar3 == (spvc_combined_image_sampler *)&other->stack_storage) {
    reserve(this,(other->super_VectorView<spvc_combined_image_sampler>).buffer_size);
    if ((other->super_VectorView<spvc_combined_image_sampler>).buffer_size == 0) {
      uVar6 = 0;
    }
    else {
      lVar4 = 0;
      uVar5 = 0;
      do {
        psVar3 = (this->super_VectorView<spvc_combined_image_sampler>).ptr;
        psVar1 = (other->super_VectorView<spvc_combined_image_sampler>).ptr;
        *(undefined4 *)((long)&psVar3->sampler_id + lVar4) =
             *(undefined4 *)((long)&psVar1->sampler_id + lVar4);
        *(undefined8 *)((long)&psVar3->combined_id + lVar4) =
             *(undefined8 *)((long)&psVar1->combined_id + lVar4);
        uVar5 = uVar5 + 1;
        uVar6 = (other->super_VectorView<spvc_combined_image_sampler>).buffer_size;
        lVar4 = lVar4 + 0xc;
      } while (uVar5 < uVar6);
    }
    (this->super_VectorView<spvc_combined_image_sampler>).buffer_size = uVar6;
    (other->super_VectorView<spvc_combined_image_sampler>).buffer_size = 0;
  }
  else {
    psVar1 = (this->super_VectorView<spvc_combined_image_sampler>).ptr;
    if (psVar1 != (spvc_combined_image_sampler *)&this->stack_storage) {
      free(psVar1);
      psVar3 = (other->super_VectorView<spvc_combined_image_sampler>).ptr;
    }
    (this->super_VectorView<spvc_combined_image_sampler>).ptr = psVar3;
    sVar2 = other->buffer_capacity;
    (this->super_VectorView<spvc_combined_image_sampler>).buffer_size =
         (other->super_VectorView<spvc_combined_image_sampler>).buffer_size;
    this->buffer_capacity = sVar2;
    (other->super_VectorView<spvc_combined_image_sampler>).ptr = (spvc_combined_image_sampler *)0x0;
    (other->super_VectorView<spvc_combined_image_sampler>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}